

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::CountSetBits_i32(w3Interp *this)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  uint32_t *a;
  w3Interp *this_local;
  
  puVar2 = w3Stack::u32(&this->super_w3Stack);
  uVar1 = count_set_bits<unsigned_int>(*puVar2);
  *puVar2 = uVar1;
  return;
}

Assistant:

INTERP (CountSetBits_i32)
{
    uint32_t& a = u32 ();
#if (_M_AMD64 || _M_IX86) && _MSC_VER > 1100 // TODO which version
    a = __popcnt (a);
#else
    a = count_set_bits (a);
#endif
}